

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

void __thiscall
JsUtil::
BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<JITJavascriptString_*,_void_*,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::DictAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_Js::BranchDictionaryWrapper<JITJavascriptString_*>::SimpleDictionaryEntryWithFixUp,_JsUtil::NoResizeLock>
         *this)

{
  int iVar1;
  uint newSize;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  hash_t hashCode;
  long lVar6;
  uint uVar7;
  uint bucketCount;
  int *local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  uVar4 = this->count;
  newSize = uVar4 * 2;
  bucketCount = 4;
  if ((8 < newSize) && (uVar7 = uVar4 & 0x7fffffff, bucketCount = uVar7, (uVar4 - 1 & uVar7) != 0))
  {
    iVar1 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    bucketCount = 2;
    if (uVar7 != 1) {
      bucketCount = 1 << (-((byte)iVar1 ^ 0x1f) & 0x1f);
    }
  }
  local_40 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    newBuckets = (int *)AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<Js::BranchDictionaryWrapper<JITJavascriptString*>::SimpleDictionaryEntryWithFixUp<JITJavascriptString*,void*>,void*,Js::BranchDictionaryWrapper<JITJavascriptString*>::DictAllocator>
              ((SimpleDictionaryEntryWithFixUp<JITJavascriptString_*,_void_*> *)newBuckets,
               (long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = (Type)newBuckets;
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<Js::BranchDictionaryWrapper<JITJavascriptString*>::SimpleDictionaryEntryWithFixUp<JITJavascriptString*,void*>,void*,Js::BranchDictionaryWrapper<JITJavascriptString*>::DictAllocator>
              ((SimpleDictionaryEntryWithFixUp<JITJavascriptString_*,_void_*> *)newBuckets,
               (long)(int)newSize,this->entries,(long)this->count);
    this->modFunctionIndex = 0x4b;
    if (0 < this->count) {
      lVar6 = 0;
      do {
        if (-2 < newBuckets[lVar6 * 6 + 2]) {
          uVar3 = (ulong)*(uint *)(*(long *)(newBuckets + lVar6 * 6 + 4) + 0x18);
          if (uVar3 == 0) {
            hashCode = 0x2393b8b;
          }
          else {
            uVar4 = 0x811c9dc5;
            uVar5 = 0;
            do {
              uVar7 = *(ushort *)
                       (*(long *)(*(long *)(newBuckets + lVar6 * 6 + 4) + 0x10) + uVar5 * 2) ^ uVar4
              ;
              uVar4 = uVar7 * 0x1000193;
              uVar5 = uVar5 + 1;
            } while (uVar3 != uVar5);
            hashCode = uVar7 * 0x2000326 + 1;
          }
          uVar2 = GetBucket(hashCode,bucketCount,this->modFunctionIndex);
          newBuckets[lVar6 * 6 + 2] = local_40[(int)uVar2];
          local_40[(int)uVar2] = (int)lVar6;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->count);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_40;
    this->entries = (Type)newBuckets;
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }